

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSOSerializer.cpp
# Opt level: O1

bool Diligent::PSOSerializer<(Diligent::SerializerMode)0>::SerializeCreateInfo
               (Serializer<(Diligent::SerializerMode)0> *Ser,
               ConstQual<TilePipelineStateCreateInfo> *CreateInfo,ConstQual<TPRSNames> *PRSNames,
               DynamicLinearAllocator *Allocator)

{
  bool bVar1;
  
  bVar1 = SerializeCreateInfo(Ser,&CreateInfo->super_PipelineStateCreateInfo,PRSNames,Allocator);
  if (bVar1) {
    bVar1 = Serializer<(Diligent::SerializerMode)0>::Copy<unsigned_char>
                      (Ser,&(CreateInfo->TilePipeline).NumRenderTargets,1);
    if (bVar1) {
      bVar1 = Serializer<(Diligent::SerializerMode)0>::operator()
                        (Ser,&(CreateInfo->TilePipeline).SampleCount,
                         &(CreateInfo->TilePipeline).RTVFormats);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool PSOSerializer<Mode>::SerializeCreateInfo(
    Serializer<Mode>&                       Ser,
    ConstQual<TilePipelineStateCreateInfo>& CreateInfo,
    ConstQual<TPRSNames>&                   PRSNames,
    DynamicLinearAllocator*                 Allocator)
{
    if (!SerializeCreateInfo(Ser, static_cast<ConstQual<PipelineStateCreateInfo>&>(CreateInfo), PRSNames, Allocator))
        return false;

    // Serialize TilePipelineDesc
    return Ser(CreateInfo.TilePipeline.NumRenderTargets,
               CreateInfo.TilePipeline.SampleCount,
               CreateInfo.TilePipeline.RTVFormats);

    ASSERT_SIZEOF64(TilePipelineStateCreateInfo, 128, "Did you add a new member to TilePipelineStateCreateInfo? Please add serialization here.");
}